

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O1

int __thiscall
anon_unknown.dwarf_e23c::MovieState::streamComponentOpen(MovieState *this,uint stream_index)

{
  int iVar1;
  AVCodecContext *pAVar2;
  long lVar3;
  char *__s;
  size_t sVar4;
  ostream *poVar5;
  uint uVar6;
  long lVar7;
  AVCodecCtxPtr avctx;
  _Head_base<0UL,_AVCodecContext_*,_false> local_30;
  
  if (((this->mFormatCtx)._M_t.
       super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
       super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
       super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->nb_streams <= stream_index) {
    return -1;
  }
  pAVar2 = (AVCodecContext *)avcodec_alloc_context3(0);
  uVar6 = 0xffffffff;
  local_30._M_head_impl = pAVar2;
  if ((pAVar2 != (AVCodecContext *)0x0) &&
     (iVar1 = avcodec_parameters_to_context
                        (pAVar2,((this->mFormatCtx)._M_t.
                                 super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>
                                 .super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->
                                streams[stream_index]->codecpar), iVar1 == 0)) {
    lVar3 = avcodec_find_decoder(pAVar2->codec_id);
    if ((lVar3 == 0) || (iVar1 = avcodec_open2(pAVar2,lVar3,0), iVar1 < 0)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Unsupported codec: ",0x13);
      __s = (char *)avcodec_get_name(pAVar2->codec_id);
      if (__s == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x1101f0);
      }
      else {
        sVar4 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," (0x",4);
      *(uint *)(_ITM_registerTMCloneTable + *(long *)(std::cerr + -0x18)) =
           *(uint *)(_ITM_registerTMCloneTable + *(long *)(std::cerr + -0x18)) & 0xffffffb5 | 8;
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,pAVar2->codec_id);
      *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
           *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 2;
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
    }
    else {
      if (pAVar2->codec_type == AVMEDIA_TYPE_AUDIO) {
        lVar7 = 0x38;
        lVar3 = 0x30;
      }
      else {
        if (pAVar2->codec_type != AVMEDIA_TYPE_VIDEO) goto LAB_0010748b;
        lVar7 = 0x288;
        lVar3 = 0x280;
      }
      *(AVStream **)
       ((long)&(this->mIOContext)._M_t.
               super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>._M_t.
               super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>.
               super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl + lVar3) =
           ((this->mFormatCtx)._M_t.
            super___uniq_ptr_impl<AVFormatContext,_(anonymous_namespace)::AVFormatCtxDeleter>._M_t.
            super__Tuple_impl<0UL,_AVFormatContext_*,_(anonymous_namespace)::AVFormatCtxDeleter>.
            super__Head_base<0UL,_AVFormatContext_*,_false>._M_head_impl)->streams[stream_index];
      std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::operator=
                ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)
                 ((long)&(this->mIOContext)._M_t.
                         super___uniq_ptr_impl<AVIOContext,_(anonymous_namespace)::AVIOContextDeleter>
                         ._M_t.
                         super__Tuple_impl<0UL,_AVIOContext_*,_(anonymous_namespace)::AVIOContextDeleter>
                         .super__Head_base<0UL,_AVIOContext_*,_false>._M_head_impl + lVar7),
                 (unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)&local_30);
      uVar6 = stream_index;
    }
  }
LAB_0010748b:
  std::unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter>::~unique_ptr
            ((unique_ptr<AVCodecContext,_(anonymous_namespace)::AVCodecCtxDeleter> *)&local_30);
  return uVar6;
}

Assistant:

void operator()(AVFrame *ptr) { av_frame_free(&ptr); }